

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

void Fossilize::Hashing::hash_specialization_info(Hasher *h,VkSpecializationInfo *spec)

{
  uint uVar1;
  VkSpecializationMapEntry *pVVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  Hasher::data<unsigned_char>(h,(uchar *)spec->pData,spec->dataSize);
  uVar1 = spec->mapEntryCount;
  uVar4 = ((spec->dataSize & 0xffffffff ^ h->h * 0x100000001b3) * 0x100000001b3 ^
          spec->dataSize >> 0x20) * 0x100000001b3 ^ (ulong)uVar1;
  h->h = uVar4;
  pVVar2 = spec->pMapEntries;
  for (lVar5 = 0; (ulong)uVar1 << 4 != lVar5; lVar5 = lVar5 + 0x10) {
    uVar3 = *(ulong *)((long)&pVVar2->size + lVar5);
    uVar4 = ((uVar3 & 0xffffffff ^
             (uVar4 * 0x100000001b3 ^ (ulong)*(uint *)((long)&pVVar2->offset + lVar5)) *
             0x100000001b3) * 0x100000001b3 ^ uVar3 >> 0x20) * 0x100000001b3 ^
            (ulong)*(uint *)((long)&pVVar2->constantID + lVar5);
    h->h = uVar4;
  }
  return;
}

Assistant:

static void hash_specialization_info(Hasher &h, const VkSpecializationInfo &spec)
{
	h.data(static_cast<const uint8_t *>(spec.pData), spec.dataSize);
	h.u64(spec.dataSize);
	h.u32(spec.mapEntryCount);
	for (uint32_t i = 0; i < spec.mapEntryCount; i++)
	{
		h.u32(spec.pMapEntries[i].offset);
		h.u64(spec.pMapEntries[i].size);
		h.u32(spec.pMapEntries[i].constantID);
	}
}